

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void sendfile_nodata_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  ssize_t sVar2;
  int iVar3;
  uint file;
  __uid_t _Var4;
  uv_loop_t *puVar5;
  size_t sVar6;
  void *pvVar7;
  uv_loop_t *puVar8;
  int __fd;
  uv_file uVar9;
  uv_loop_t *unaff_RBX;
  uv_loop_t *puVar10;
  uv_loop_t *puVar11;
  uv_fs_t *puVar12;
  uv_fs_t *puVar13;
  char *pcVar14;
  uv_fs_t *puVar15;
  uv_fs_t *unaff_R14;
  uv_fs_t *req_00;
  uv_fs_t *puVar16;
  uv_buf_t uVar17;
  uv_fs_t uStackY_1198;
  uv_loop_t *puStackY_fe0;
  code *pcStackY_fd8;
  undefined1 auStack_fc0 [576];
  uv_loop_t *puStack_d80;
  uv_loop_t *puStack_c20;
  uv_fs_t *puStack_c18;
  undefined1 auStack_c00 [568];
  void *pvStack_9c8;
  uint uStack_9a8;
  uv_loop_t *puStack_868;
  uv_fs_t uStack_858;
  uv_loop_t *puStack_6a0;
  uv_fs_t *puStack_698;
  uv_fs_t uStack_680;
  uv_loop_t *puStack_4c8;
  uv_fs_t *puStack_4c0;
  uv__io_cb p_Stack_4b8;
  stat64 sStack_4a0;
  uv_fs_t uStack_410;
  uv_loop_t *puStack_258;
  uv_fs_t *puStack_250;
  uv_loop_t *puStack_240;
  uv_fs_t *puStack_238;
  code *pcStack_230;
  undefined1 auStack_218 [32];
  anon_union_8_2_bf76bca6_for_active_reqs aStack_1f8;
  void *pvStack_1a0;
  uv_loop_t *puStack_40;
  code *pcStack_38;
  uv_loop_t *puStack_28;
  
  if (req == &sendfile_req) {
    if (sendfile_req.fs_type != UV_FS_SENDFILE) goto LAB_0015a4bb;
    if (sendfile_req.result == 0) {
      sendfile_cb_count = sendfile_cb_count + 1;
      uv_fs_req_cleanup(&sendfile_req);
      return;
    }
  }
  else {
    sendfile_nodata_cb_cold_1();
LAB_0015a4bb:
    sendfile_nodata_cb_cold_2();
  }
  sendfile_nodata_cb_cold_3();
  puVar5 = uv_default_loop();
  loop = puVar5;
  iVar3 = uv_fs_mkdtemp(puVar5,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  if (iVar3 == 0) {
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdtemp_cb_count != 1) goto LAB_0015a5c8;
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdtemp((uv_loop_t *)0x0,&mkdtemp_req2,"test_dir_XXXXXX",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015a5cd;
    check_mkdtemp_result(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)mkdtemp_req1.path;
    puVar5 = (uv_loop_t *)mkdtemp_req1.path;
    iVar3 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
    if (iVar3 == 0) goto LAB_0015a5d2;
    rmdir((char *)unaff_RBX);
    rmdir(mkdtemp_req2.path);
    uv_fs_req_cleanup(&mkdtemp_req1);
    uv_fs_req_cleanup(&mkdtemp_req2);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_mkdtemp_cold_1();
LAB_0015a5c8:
    run_test_fs_mkdtemp_cold_2();
LAB_0015a5cd:
    run_test_fs_mkdtemp_cold_3();
LAB_0015a5d2:
    run_test_fs_mkdtemp_cold_5();
  }
  run_test_fs_mkdtemp_cold_4();
  if (puVar5 == (uv_loop_t *)&mkdtemp_req1) {
    check_mkdtemp_result(&mkdtemp_req1);
    mkdtemp_cb_count = mkdtemp_cb_count + 1;
    return;
  }
  mkdtemp_cb_cold_1();
  puStack_28 = unaff_RBX;
  if (puVar5->backend_fd == UV_FS_MKDTEMP) {
    if (puVar5->watcher_queue[0] != (void *)0x0) goto LAB_0015a6ba;
    unaff_R14 = (uv_fs_t *)puVar5->watchers;
    if (unaff_R14 == (uv_fs_t *)0x0) goto LAB_0015a6bf;
    pcStack_38 = (_func_void *)0x15a633;
    sVar6 = strlen((char *)unaff_R14);
    if (sVar6 != 0xf) goto LAB_0015a6c4;
    if ((char)unaff_R14->type != 0x5f || unaff_R14->data != (void *)0x7269645f74736574)
    goto LAB_0015a6c9;
    if (*(short *)&unaff_R14->field_0xd == 0x5858 &&
        *(int *)((long)&unaff_R14->type + 1) == 0x58585858) goto LAB_0015a6ce;
    pcStack_38 = (_func_void *)0x15a67d;
    check_permission((char *)unaff_R14,0x1c0);
    pcStack_38 = (_func_void *)0x15a691;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,(char *)puVar5->watchers,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015a6d3;
    if ((*(byte *)((long)stat_req.ptr + 9) & 0x40) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return;
    }
  }
  else {
    pcStack_38 = (_func_void *)0x15a6ba;
    check_mkdtemp_result_cold_1();
    puVar5 = unaff_RBX;
LAB_0015a6ba:
    pcStack_38 = (_func_void *)0x15a6bf;
    check_mkdtemp_result_cold_2();
LAB_0015a6bf:
    pcStack_38 = (_func_void *)0x15a6c4;
    check_mkdtemp_result_cold_8();
LAB_0015a6c4:
    pcStack_38 = (_func_void *)0x15a6c9;
    check_mkdtemp_result_cold_3();
LAB_0015a6c9:
    pcStack_38 = (_func_void *)0x15a6ce;
    check_mkdtemp_result_cold_4();
LAB_0015a6ce:
    pcStack_38 = (_func_void *)0x15a6d3;
    check_mkdtemp_result_cold_7();
LAB_0015a6d3:
    pcStack_38 = (_func_void *)0x15a6d8;
    check_mkdtemp_result_cold_5();
  }
  pcStack_38 = run_test_fs_mkstemp;
  check_mkdtemp_result_cold_6();
  puVar8 = (uv_loop_t *)auStack_218;
  auStack_218[0] = 't';
  auStack_218[1] = 'e';
  auStack_218[2] = 's';
  auStack_218[3] = 't';
  auStack_218[4] = '_';
  auStack_218[5] = 'f';
  auStack_218[6] = 'i';
  auStack_218[7] = 'l';
  auStack_218[8] = 'e';
  auStack_218[9] = '_';
  auStack_218[10] = 'X';
  auStack_218[0xb] = 'X';
  auStack_218[0xc] = 'X';
  auStack_218[0xd] = 'X';
  auStack_218[0xe] = 'X';
  auStack_218[0xf] = 'X';
  auStack_218[0x10] = 0;
  pcStack_230 = (code *)0x15a6ff;
  puStack_40 = puVar5;
  pcStack_38 = (code *)unaff_R14;
  loop = uv_default_loop();
  pcStack_230 = (code *)0x15a71f;
  iVar3 = uv_fs_mkstemp(loop,&mkstemp_req1,(char *)puVar8,mkstemp_cb);
  if (iVar3 == 0) {
    pcStack_230 = (code *)0x15a735;
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkstemp_cb_count != 1) goto LAB_0015a9eb;
    pcStack_230 = (code *)0x15a757;
    iVar3 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req2,auStack_218,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015a9f0;
    pcStack_230 = (code *)0x15a76b;
    check_mkstemp_result(&mkstemp_req2);
    pcStack_230 = (code *)0x15a77e;
    iVar3 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    if (iVar3 == 0) goto LAB_0015a9f5;
    aStack_1f8 = (anon_union_8_2_bf76bca6_for_active_reqs)0xffffffffffffffea;
    pcStack_230 = (code *)0x15a7a6;
    iVar3 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req3,"test_file",(uv_fs_cb)0x0);
    if (aStack_1f8.unused != (void *)(long)iVar3) goto LAB_0015a9fa;
    aStack_1f8.unused = (void *)0x0;
    pcStack_230 = (code *)0x15a7d2;
    pvVar7 = (void *)strlen(mkstemp_req3.path);
    if (aStack_1f8.unused != pvVar7) goto LAB_0015aa09;
    pcStack_230 = (code *)0x15a7f8;
    iov = uv_buf_init(test_buf,0xd);
    pcVar14 = (char *)0x0;
    pcStack_230 = (code *)0x15a834;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe08,
                        (uv_file)mkstemp_req1.result,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar3 != 0xd) goto LAB_0015aa18;
    if (pvStack_1a0 != (void *)0xd) goto LAB_0015aa1d;
    puVar8 = (uv_loop_t *)&stack0xfffffffffffffe08;
    pcStack_230 = (code *)0x15a859;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    pcStack_230 = (code *)0x15a86b;
    uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)puVar8,(uv_file)mkstemp_req1.result,(uv_fs_cb)0x0);
    pcStack_230 = (code *)0x15a873;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    pcStack_230 = (code *)0x15a885;
    uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)puVar8,(uv_file)mkstemp_req2.result,(uv_fs_cb)0x0);
    pcStack_230 = (code *)0x15a88d;
    uv_fs_req_cleanup((uv_fs_t *)puVar8);
    pcVar14 = (char *)0x0;
    pcStack_230 = (code *)0x15a8a6;
    file = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)puVar8,mkstemp_req1.path,0,0,(uv_fs_cb)0x0);
    if ((int)file < 0) goto LAB_0015aa22;
    puVar8 = (uv_loop_t *)(ulong)file;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe08;
    pcStack_230 = (code *)0x15a8bd;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_230 = (code *)0x15a8df;
    uVar17 = uv_buf_init(buf,0x20);
    pcVar14 = (char *)0x0;
    pcStack_230 = (code *)0x15a915;
    iov = uVar17;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,unaff_R14,file,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015aa27;
    if ((long)pvStack_1a0 < 0) goto LAB_0015aa2c;
    pcVar14 = buf;
    pcStack_230 = (code *)0x15a93f;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_0015aa31;
    pcStack_230 = (code *)0x15a954;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe08);
    pcStack_230 = (code *)0x15a962;
    uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe08,file,(uv_fs_cb)0x0);
    pcStack_230 = (code *)0x15a96a;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe08);
    pcStack_230 = (code *)0x15a97d;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_230 = (code *)0x15a990;
    unlink(mkstemp_req2.path);
    pcStack_230 = (code *)0x15a998;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_230 = (code *)0x15a9a0;
    uv_fs_req_cleanup(&mkstemp_req2);
    pcStack_230 = (code *)0x15a9a5;
    puVar8 = uv_default_loop();
    pcStack_230 = (code *)0x15a9b9;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    pcStack_230 = (code *)0x15a9c3;
    uv_run(puVar8,UV_RUN_DEFAULT);
    pcStack_230 = (code *)0x15a9c8;
    pcVar14 = (char *)uv_default_loop();
    pcStack_230 = (code *)0x15a9d0;
    iVar3 = uv_loop_close((uv_loop_t *)pcVar14);
    if (iVar3 == 0) {
      pcStack_230 = (code *)0x15a9d9;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_230 = (code *)0x15a9eb;
    run_test_fs_mkstemp_cold_1();
LAB_0015a9eb:
    pcStack_230 = (code *)0x15a9f0;
    run_test_fs_mkstemp_cold_2();
LAB_0015a9f0:
    pcStack_230 = (code *)0x15a9f5;
    run_test_fs_mkstemp_cold_3();
LAB_0015a9f5:
    pcStack_230 = (code *)0x15a9fa;
    run_test_fs_mkstemp_cold_13();
LAB_0015a9fa:
    pcStack_230 = (code *)0x15aa09;
    run_test_fs_mkstemp_cold_4();
LAB_0015aa09:
    pcVar14 = (char *)&stack0xfffffffffffffe08;
    pcStack_230 = (code *)0x15aa18;
    run_test_fs_mkstemp_cold_5();
LAB_0015aa18:
    pcStack_230 = (code *)0x15aa1d;
    run_test_fs_mkstemp_cold_6();
LAB_0015aa1d:
    pcStack_230 = (code *)0x15aa22;
    run_test_fs_mkstemp_cold_7();
LAB_0015aa22:
    pcStack_230 = (code *)0x15aa27;
    run_test_fs_mkstemp_cold_8();
LAB_0015aa27:
    pcStack_230 = (code *)0x15aa2c;
    run_test_fs_mkstemp_cold_9();
LAB_0015aa2c:
    pcStack_230 = (code *)0x15aa31;
    run_test_fs_mkstemp_cold_10();
LAB_0015aa31:
    pcStack_230 = (code *)0x15aa36;
    run_test_fs_mkstemp_cold_11();
  }
  pcStack_230 = mkstemp_cb;
  run_test_fs_mkstemp_cold_12();
  if ((uv_fs_t *)pcVar14 == &mkstemp_req1) {
    puStack_238 = (uv_fs_t *)0x15aa54;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return;
  }
  puStack_238 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  puStack_240 = puVar8;
  puStack_238 = unaff_R14;
  if (((uv_loop_t *)pcVar14)->backend_fd == UV_FS_MKSTEMP) {
    if ((long)((uv_loop_t *)pcVar14)->watcher_queue[0] < 0) goto LAB_0015ab18;
    puVar13 = (uv_fs_t *)((uv_loop_t *)pcVar14)->watchers;
    if (puVar13 == (uv_fs_t *)0x0) goto LAB_0015ab1d;
    puStack_250 = (uv_fs_t *)0x15aa92;
    sVar6 = strlen((char *)puVar13);
    if (sVar6 != 0x10) goto LAB_0015ab22;
    if ((short)puVar13->type != 0x5f65 || puVar13->data != (void *)0x6c69665f74736574)
    goto LAB_0015ab27;
    if (*(short *)&puVar13->field_0xe == 0x5858 && *(int *)((long)&puVar13->type + 2) == 0x58585858)
    goto LAB_0015ab2c;
    puStack_250 = (uv_fs_t *)0x15aadf;
    check_permission((char *)puVar13,0x180);
    puStack_250 = (uv_fs_t *)0x15aaf3;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,(char *)((uv_loop_t *)pcVar14)->watchers,
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015ab31;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return;
    }
  }
  else {
    puStack_250 = (uv_fs_t *)0x15ab18;
    check_mkstemp_result_cold_1();
    pcVar14 = (char *)puVar8;
LAB_0015ab18:
    puStack_250 = (uv_fs_t *)0x15ab1d;
    check_mkstemp_result_cold_2();
    puVar13 = unaff_R14;
LAB_0015ab1d:
    puStack_250 = (uv_fs_t *)0x15ab22;
    check_mkstemp_result_cold_8();
LAB_0015ab22:
    puStack_250 = (uv_fs_t *)0x15ab27;
    check_mkstemp_result_cold_3();
LAB_0015ab27:
    puStack_250 = (uv_fs_t *)0x15ab2c;
    check_mkstemp_result_cold_4();
LAB_0015ab2c:
    puStack_250 = (uv_fs_t *)0x15ab31;
    check_mkstemp_result_cold_7();
LAB_0015ab31:
    puStack_250 = (uv_fs_t *)0x15ab36;
    check_mkstemp_result_cold_5();
  }
  puStack_250 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  puVar5 = (uv_loop_t *)0x1a3557;
  p_Stack_4b8 = (uv__io_cb)0x15ab54;
  puStack_258 = (uv_loop_t *)pcVar14;
  puStack_250 = puVar13;
  unlink("test_file");
  p_Stack_4b8 = (uv__io_cb)0x15ab59;
  loop = uv_default_loop();
  puVar8 = (uv_loop_t *)0x0;
  p_Stack_4b8 = (uv__io_cb)0x15ab80;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_410,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_410.result;
  if (iVar3 < 0) {
    p_Stack_4b8 = (uv__io_cb)0x15aeea;
    run_test_fs_fstat_cold_1();
LAB_0015aeea:
    p_Stack_4b8 = (uv__io_cb)0x15aeef;
    run_test_fs_fstat_cold_2();
LAB_0015aeef:
    p_Stack_4b8 = (uv__io_cb)0x15aef4;
    run_test_fs_fstat_cold_3();
LAB_0015aef4:
    p_Stack_4b8 = (uv__io_cb)0x15aef9;
    run_test_fs_fstat_cold_4();
LAB_0015aef9:
    p_Stack_4b8 = (uv__io_cb)0x15aefe;
    run_test_fs_fstat_cold_5();
LAB_0015aefe:
    p_Stack_4b8 = (uv__io_cb)0x15af03;
    run_test_fs_fstat_cold_6();
LAB_0015af03:
    p_Stack_4b8 = (uv__io_cb)0x15af08;
    run_test_fs_fstat_cold_7();
LAB_0015af08:
    p_Stack_4b8 = (uv__io_cb)0x15af0d;
    run_test_fs_fstat_cold_8();
LAB_0015af0d:
    p_Stack_4b8 = (uv__io_cb)0x15af12;
    run_test_fs_fstat_cold_9();
LAB_0015af12:
    p_Stack_4b8 = (uv__io_cb)0x15af17;
    run_test_fs_fstat_cold_10();
LAB_0015af17:
    p_Stack_4b8 = (uv__io_cb)0x15af1c;
    run_test_fs_fstat_cold_11();
LAB_0015af1c:
    p_Stack_4b8 = (uv__io_cb)0x15af21;
    run_test_fs_fstat_cold_12();
LAB_0015af21:
    p_Stack_4b8 = (uv__io_cb)0x15af26;
    run_test_fs_fstat_cold_13();
LAB_0015af26:
    p_Stack_4b8 = (uv__io_cb)0x15af2b;
    run_test_fs_fstat_cold_14();
LAB_0015af2b:
    p_Stack_4b8 = (uv__io_cb)0x15af30;
    run_test_fs_fstat_cold_15();
LAB_0015af30:
    p_Stack_4b8 = (uv__io_cb)0x15af35;
    run_test_fs_fstat_cold_16();
LAB_0015af35:
    p_Stack_4b8 = (uv__io_cb)0x15af3a;
    run_test_fs_fstat_cold_17();
LAB_0015af3a:
    p_Stack_4b8 = (uv__io_cb)0x15af3f;
    run_test_fs_fstat_cold_18();
LAB_0015af3f:
    p_Stack_4b8 = (uv__io_cb)0x15af44;
    run_test_fs_fstat_cold_19();
LAB_0015af44:
    p_Stack_4b8 = (uv__io_cb)0x15af49;
    run_test_fs_fstat_cold_20();
LAB_0015af49:
    p_Stack_4b8 = (uv__io_cb)0x15af4e;
    run_test_fs_fstat_cold_21();
LAB_0015af4e:
    p_Stack_4b8 = (uv__io_cb)0x15af53;
    run_test_fs_fstat_cold_22();
LAB_0015af53:
    p_Stack_4b8 = (uv__io_cb)0x15af58;
    run_test_fs_fstat_cold_23();
LAB_0015af58:
    p_Stack_4b8 = (uv__io_cb)0x15af5d;
    run_test_fs_fstat_cold_24();
LAB_0015af5d:
    p_Stack_4b8 = (uv__io_cb)0x15af62;
    run_test_fs_fstat_cold_25();
LAB_0015af62:
    p_Stack_4b8 = (uv__io_cb)0x15af67;
    run_test_fs_fstat_cold_26();
LAB_0015af67:
    p_Stack_4b8 = (uv__io_cb)0x15af6c;
    run_test_fs_fstat_cold_27();
LAB_0015af6c:
    p_Stack_4b8 = (uv__io_cb)0x15af71;
    run_test_fs_fstat_cold_28();
LAB_0015af71:
    p_Stack_4b8 = (uv__io_cb)0x15af76;
    run_test_fs_fstat_cold_29();
LAB_0015af76:
    p_Stack_4b8 = (uv__io_cb)0x15af7b;
    run_test_fs_fstat_cold_30();
LAB_0015af7b:
    p_Stack_4b8 = (uv__io_cb)0x15af80;
    run_test_fs_fstat_cold_31();
LAB_0015af80:
    p_Stack_4b8 = (uv__io_cb)0x15af85;
    run_test_fs_fstat_cold_32();
LAB_0015af85:
    p_Stack_4b8 = (uv__io_cb)0x15af8a;
    run_test_fs_fstat_cold_33();
LAB_0015af8a:
    p_Stack_4b8 = (uv__io_cb)0x15af8f;
    run_test_fs_fstat_cold_34();
LAB_0015af8f:
    p_Stack_4b8 = (uv__io_cb)0x15af94;
    run_test_fs_fstat_cold_35();
  }
  else {
    puVar5 = (uv_loop_t *)uStack_410.result;
    if (uStack_410.result < 0) goto LAB_0015aeea;
    p_Stack_4b8 = (uv__io_cb)0x15aba6;
    uv_fs_req_cleanup(&uStack_410);
    __fd = (int)sVar2;
    puVar8 = (uv_loop_t *)(sVar2 & 0xffffffff);
    p_Stack_4b8 = (uv__io_cb)0x15abb2;
    iVar3 = fstat64(__fd,&sStack_4a0);
    puVar5 = (uv_loop_t *)sVar2;
    if (iVar3 != 0) goto LAB_0015aeef;
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b8 = (uv__io_cb)0x15abcd;
    iVar3 = uv_fs_fstat((uv_loop_t *)0x0,&uStack_410,__fd,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015aef4;
    if ((uv_loop_t *)uStack_410.result != (uv_loop_t *)0x0) goto LAB_0015aef9;
    pvVar7 = (void *)((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_gid;
    if ((pvVar7 != (void *)0x0) && (pvVar7 != (void *)sStack_4a0.st_ctim.tv_sec)) goto LAB_0015aefe;
    pvVar7 = (void *)((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_rdev;
    if ((pvVar7 != (void *)0x0) && (pvVar7 != (void *)sStack_4a0.st_ctim.tv_nsec))
    goto LAB_0015af03;
    p_Stack_4b8 = (uv__io_cb)0x15ac2e;
    uVar17 = uv_buf_init(test_buf,0xd);
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b8 = (uv__io_cb)0x15ac69;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&uStack_410,__fd,&iov,1,-1,(uv_fs_cb)0x0);
    if (iVar3 != 0xd) goto LAB_0015af08;
    if ((uv_loop_t *)uStack_410.result != (uv_loop_t *)0xd) goto LAB_0015af0d;
    puVar13 = &uStack_410;
    p_Stack_4b8 = (uv__io_cb)0x15ac91;
    uv_fs_req_cleanup(puVar13);
    p_Stack_4b8 = (uv__io_cb)0x15aca8;
    memset(&uStack_410.statbuf,0xaa,0xa0);
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b8 = (uv__io_cb)0x15acb6;
    iVar3 = uv_fs_fstat((uv_loop_t *)0x0,puVar13,__fd,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015af12;
    if ((uv_loop_t *)uStack_410.result != (uv_loop_t *)0x0) goto LAB_0015af17;
    puVar13 = (uv_fs_t *)uStack_410.ptr;
    if (((void **)((long)uStack_410.ptr + 0x10))[5] != (void *)0xd) goto LAB_0015af1c;
    puVar8 = (uv_loop_t *)(sVar2 & 0xffffffff);
    p_Stack_4b8 = (uv__io_cb)0x15acec;
    iVar3 = fstat64(__fd,&sStack_4a0);
    if (iVar3 != 0) goto LAB_0015af21;
    if (*(void **)uStack_410.ptr != (void *)sStack_4a0.st_dev) goto LAB_0015af26;
    if (*(ulong *)((long)uStack_410.ptr + 8) != (ulong)sStack_4a0.st_mode) goto LAB_0015af2b;
    if (*(void **)((long)uStack_410.ptr + 0x10) != (void *)sStack_4a0.st_nlink) goto LAB_0015af30;
    if (((void **)((long)uStack_410.ptr + 0x10))[1] != (void *)(ulong)sStack_4a0.st_uid)
    goto LAB_0015af35;
    if (((void **)((long)uStack_410.ptr + 0x10))[2] != (void *)(ulong)sStack_4a0.st_gid)
    goto LAB_0015af3a;
    if (((void **)((long)uStack_410.ptr + 0x10))[3] != (void *)sStack_4a0.st_rdev)
    goto LAB_0015af3f;
    if (((void **)((long)uStack_410.ptr + 0x10))[4] != (void *)sStack_4a0.st_ino) goto LAB_0015af44;
    if (((void **)((long)uStack_410.ptr + 0x10))[5] != (void *)sStack_4a0.st_size)
    goto LAB_0015af49;
    if (*(uint64_t *)((long)uStack_410.ptr + 0x40) != sStack_4a0.st_blksize) goto LAB_0015af4e;
    if (*(uv_loop_t **)((long)uStack_410.ptr + 0x48) != (uv_loop_t *)sStack_4a0.st_blocks)
    goto LAB_0015af53;
    if (*(int (*) [2])((long)uStack_410.ptr + 0x60) != (int  [2])sStack_4a0.st_atim.tv_sec)
    goto LAB_0015af58;
    if (*(uv__io_cb *)((long)uStack_410.ptr + 0x68) != (uv__io_cb)sStack_4a0.st_atim.tv_nsec)
    goto LAB_0015af5d;
    if ((void *)((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_dev !=
        (void *)sStack_4a0.st_mtim.tv_sec) goto LAB_0015af62;
    if ((void *)((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_mode !=
        (void *)sStack_4a0.st_mtim.tv_nsec) goto LAB_0015af67;
    if ((void *)((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_nlink !=
        (void *)sStack_4a0.st_ctim.tv_sec) goto LAB_0015af6c;
    if ((void *)((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_uid !=
        (void *)sStack_4a0.st_ctim.tv_nsec) goto LAB_0015af71;
    if (*(uv_fs_cb *)((long)uStack_410.ptr + 0x50) != (uv_fs_cb)0x0) goto LAB_0015af76;
    if (*(ssize_t *)((long)uStack_410.ptr + 0x58) != 0) goto LAB_0015af7b;
    puVar13 = &uStack_410;
    p_Stack_4b8 = (uv__io_cb)0x15ae0f;
    uv_fs_req_cleanup(puVar13);
    p_Stack_4b8 = (uv__io_cb)0x15ae27;
    puVar8 = loop;
    iVar3 = uv_fs_fstat(loop,puVar13,__fd,fstat_cb);
    if (iVar3 != 0) goto LAB_0015af80;
    p_Stack_4b8 = (uv__io_cb)0x15ae3d;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fstat_cb_count != 1) goto LAB_0015af85;
    puVar8 = (uv_loop_t *)0x0;
    p_Stack_4b8 = (uv__io_cb)0x15ae5d;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&uStack_410,__fd,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015af8a;
    if ((uv_loop_t *)uStack_410.result != (uv_loop_t *)0x0) goto LAB_0015af8f;
    p_Stack_4b8 = (uv__io_cb)0x15ae81;
    uv_fs_req_cleanup(&uStack_410);
    p_Stack_4b8 = (uv__io_cb)0x15ae8f;
    uv_run(loop,UV_RUN_DEFAULT);
    p_Stack_4b8 = (uv__io_cb)0x15ae9b;
    unlink("test_file");
    p_Stack_4b8 = (uv__io_cb)0x15aea0;
    puVar5 = uv_default_loop();
    p_Stack_4b8 = (uv__io_cb)0x15aeb4;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    p_Stack_4b8 = (uv__io_cb)0x15aebe;
    uv_run(puVar5,UV_RUN_DEFAULT);
    p_Stack_4b8 = (uv__io_cb)0x15aec3;
    puVar8 = uv_default_loop();
    p_Stack_4b8 = (uv__io_cb)0x15aecb;
    iVar3 = uv_loop_close(puVar8);
    if (iVar3 == 0) {
      p_Stack_4b8 = (uv__io_cb)0x15aed8;
      uv_library_shutdown();
      return;
    }
  }
  p_Stack_4b8 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar8->backend_fd == 8) {
    if (puVar8->watcher_queue[0] != (void *)0x0) goto LAB_0015afc4;
    if (*(long *)((long)puVar8->watcher_queue[1] + 0x38) == 0xd) {
      puStack_4c0 = (uv_fs_t *)0x15afb7;
      uv_fs_req_cleanup((uv_fs_t *)puVar8);
      fstat_cb_count = fstat_cb_count + 1;
      return;
    }
  }
  else {
    puStack_4c0 = (uv_fs_t *)0x15afc4;
    fstat_cb_cold_1();
LAB_0015afc4:
    puStack_4c0 = (uv_fs_t *)0x15afc9;
    fstat_cb_cold_2();
  }
  puStack_4c0 = (uv_fs_t *)run_test_fs_access;
  fstat_cb_cold_3();
  req_00 = &uStack_680;
  puVar8 = (uv_loop_t *)&uStack_680;
  puVar10 = (uv_loop_t *)0x1a3557;
  puStack_4c8 = puVar5;
  puStack_4c0 = puVar13;
  unlink("test_file");
  rmdir("test_dir");
  loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  iVar3 = uv_fs_access((uv_loop_t *)0x0,&uStack_680,"test_file",0,(uv_fs_cb)0x0);
  if (iVar3 < 0) {
    if (-1 < uStack_680.result) goto LAB_0015b23c;
    uv_fs_req_cleanup(&uStack_680);
    puVar5 = loop;
    iVar3 = uv_fs_access(loop,&uStack_680,"test_file",0,access_cb);
    puVar10 = (uv_loop_t *)&uStack_680;
    if (iVar3 != 0) goto LAB_0015b241;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar10 = (uv_loop_t *)&uStack_680;
    if (access_cb_count != 1) goto LAB_0015b246;
    access_cb_count = 0;
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_680,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    puVar11 = (uv_loop_t *)uStack_680.result;
    puVar10 = (uv_loop_t *)&uStack_680;
    if (iVar3 < 0) goto LAB_0015b24b;
    if (uStack_680.result < 0) goto LAB_0015b250;
    uv_fs_req_cleanup(&uStack_680);
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,&uStack_680,"test_file",0,(uv_fs_cb)0x0);
    puVar13 = &uStack_680;
    if (iVar3 != 0) goto LAB_0015b255;
    puVar13 = &uStack_680;
    if ((uv_loop_t *)uStack_680.result != (uv_loop_t *)0x0) goto LAB_0015b25a;
    uv_fs_req_cleanup(&uStack_680);
    puVar5 = loop;
    iVar3 = uv_fs_access(loop,&uStack_680,"test_file",0,access_cb);
    if (iVar3 != 0) goto LAB_0015b25f;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    req_00 = &uStack_680;
    if (access_cb_count != 1) goto LAB_0015b264;
    access_cb_count = 0;
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&uStack_680,(uv_file)puVar11,(uv_fs_cb)0x0);
    req_00 = &uStack_680;
    if (iVar3 != 0) goto LAB_0015b269;
    req_00 = &uStack_680;
    if ((uv_loop_t *)uStack_680.result != (uv_loop_t *)0x0) goto LAB_0015b26e;
    uv_fs_req_cleanup(&uStack_680);
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdir((uv_loop_t *)0x0,&uStack_680,"test_dir",0x1ff,(uv_fs_cb)0x0);
    puVar11 = (uv_loop_t *)&uStack_680;
    req_00 = &uStack_680;
    if (iVar3 != 0) goto LAB_0015b273;
    uv_fs_req_cleanup(&uStack_680);
    puVar5 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,&uStack_680,"test_dir",2,(uv_fs_cb)0x0);
    req_00 = &uStack_680;
    if (iVar3 != 0) goto LAB_0015b278;
    puVar8 = (uv_loop_t *)&uStack_680;
    req_00 = &uStack_680;
    if ((uv_loop_t *)uStack_680.result != (uv_loop_t *)0x0) goto LAB_0015b27d;
    uv_fs_req_cleanup(&uStack_680);
    uv_run(loop,UV_RUN_DEFAULT);
    unlink("test_file");
    rmdir("test_dir");
    puVar8 = uv_default_loop();
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    uv_run(puVar8,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar3 = uv_loop_close(puVar5);
    req_00 = &uStack_680;
    if (iVar3 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_0015b23c:
    run_test_fs_access_cold_2();
LAB_0015b241:
    run_test_fs_access_cold_3();
LAB_0015b246:
    run_test_fs_access_cold_4();
LAB_0015b24b:
    puVar11 = puVar10;
    run_test_fs_access_cold_5();
LAB_0015b250:
    run_test_fs_access_cold_6();
LAB_0015b255:
    run_test_fs_access_cold_7();
LAB_0015b25a:
    req_00 = puVar13;
    run_test_fs_access_cold_8();
LAB_0015b25f:
    run_test_fs_access_cold_9();
LAB_0015b264:
    run_test_fs_access_cold_10();
LAB_0015b269:
    run_test_fs_access_cold_11();
LAB_0015b26e:
    run_test_fs_access_cold_12();
LAB_0015b273:
    puVar8 = puVar11;
    run_test_fs_access_cold_13();
LAB_0015b278:
    run_test_fs_access_cold_14();
LAB_0015b27d:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar5->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup((uv_fs_t *)puVar5);
    return;
  }
  access_cb_cold_1();
  puVar5 = (uv_loop_t *)0x1a3557;
  puStack_868 = (uv_loop_t *)0x15b2b9;
  puStack_6a0 = puVar8;
  puStack_698 = req_00;
  unlink("test_file");
  puStack_868 = (uv_loop_t *)0x15b2be;
  loop = uv_default_loop();
  puVar13 = &uStack_858;
  puVar8 = (uv_loop_t *)0x0;
  puStack_868 = (uv_loop_t *)0x15b2e2;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,puVar13,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_858.result;
  if (iVar3 < 0) {
    puStack_868 = (uv_loop_t *)0x15b5ba;
    run_test_fs_chmod_cold_1();
LAB_0015b5ba:
    puStack_868 = (uv_loop_t *)0x15b5bf;
    run_test_fs_chmod_cold_2();
LAB_0015b5bf:
    puStack_868 = (uv_loop_t *)0x15b5c4;
    run_test_fs_chmod_cold_3();
LAB_0015b5c4:
    puStack_868 = (uv_loop_t *)0x15b5c9;
    run_test_fs_chmod_cold_4();
LAB_0015b5c9:
    puStack_868 = (uv_loop_t *)0x15b5ce;
    run_test_fs_chmod_cold_5();
LAB_0015b5ce:
    puStack_868 = (uv_loop_t *)0x15b5d3;
    run_test_fs_chmod_cold_6();
LAB_0015b5d3:
    puStack_868 = (uv_loop_t *)0x15b5d8;
    run_test_fs_chmod_cold_7();
LAB_0015b5d8:
    puStack_868 = (uv_loop_t *)0x15b5dd;
    run_test_fs_chmod_cold_8();
LAB_0015b5dd:
    puStack_868 = (uv_loop_t *)0x15b5e2;
    run_test_fs_chmod_cold_9();
LAB_0015b5e2:
    puStack_868 = (uv_loop_t *)0x15b5e7;
    run_test_fs_chmod_cold_10();
LAB_0015b5e7:
    puStack_868 = (uv_loop_t *)0x15b5ec;
    run_test_fs_chmod_cold_11();
LAB_0015b5ec:
    puStack_868 = (uv_loop_t *)0x15b5f1;
    run_test_fs_chmod_cold_12();
LAB_0015b5f1:
    puStack_868 = (uv_loop_t *)0x15b5f6;
    run_test_fs_chmod_cold_13();
LAB_0015b5f6:
    puStack_868 = (uv_loop_t *)0x15b5fb;
    run_test_fs_chmod_cold_14();
LAB_0015b5fb:
    puStack_868 = (uv_loop_t *)0x15b600;
    run_test_fs_chmod_cold_15();
LAB_0015b600:
    puStack_868 = (uv_loop_t *)0x15b605;
    run_test_fs_chmod_cold_16();
  }
  else {
    puVar5 = (uv_loop_t *)uStack_858.result;
    if (uStack_858.result < 0) goto LAB_0015b5ba;
    req_00 = &uStack_858;
    puStack_868 = (uv_loop_t *)0x15b305;
    uv_fs_req_cleanup(req_00);
    puStack_868 = (uv_loop_t *)0x15b316;
    uVar17 = uv_buf_init(test_buf,0xd);
    puVar8 = (uv_loop_t *)0x0;
    uVar9 = (uv_file)sVar2;
    puStack_868 = (uv_loop_t *)0x15b34c;
    puVar13 = req_00;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req_00,uVar9,&iov,1,-1,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)sVar2;
    if (iVar3 != 0xd) goto LAB_0015b5bf;
    if ((uv_loop_t *)uStack_858.result != (uv_loop_t *)0xd) goto LAB_0015b5c4;
    req_00 = &uStack_858;
    puStack_868 = (uv_loop_t *)0x15b36e;
    uv_fs_req_cleanup(req_00);
    puVar8 = (uv_loop_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b387;
    puVar13 = req_00;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x80,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015b5c9;
    if ((uv_loop_t *)uStack_858.result != (uv_loop_t *)0x0) goto LAB_0015b5ce;
    req_00 = &uStack_858;
    puStack_868 = (uv_loop_t *)0x15b3a8;
    uv_fs_req_cleanup(req_00);
    puStack_868 = (uv_loop_t *)0x15b3bc;
    check_permission("test_file",0x80);
    puVar8 = (uv_loop_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b3d1;
    puVar13 = req_00;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015b5d3;
    if ((uv_loop_t *)uStack_858.result != (uv_loop_t *)0x0) goto LAB_0015b5d8;
    req_00 = &uStack_858;
    puStack_868 = (uv_loop_t *)0x15b3f2;
    uv_fs_req_cleanup(req_00);
    puStack_868 = (uv_loop_t *)0x15b403;
    check_permission("test_file",0x100);
    puVar8 = (uv_loop_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b417;
    puVar13 = req_00;
    iVar3 = uv_fs_fchmod((uv_loop_t *)0x0,req_00,uVar9,0x180,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015b5dd;
    if ((uv_loop_t *)uStack_858.result != (uv_loop_t *)0x0) goto LAB_0015b5e2;
    req_00 = &uStack_858;
    puStack_868 = (uv_loop_t *)0x15b438;
    uv_fs_req_cleanup(req_00);
    puStack_868 = (uv_loop_t *)0x15b44c;
    check_permission("test_file",0x180);
    uStack_858.data = &run_test_fs_chmod::mode;
    puStack_868 = (uv_loop_t *)0x15b474;
    puVar13 = req_00;
    puVar8 = loop;
    iVar3 = uv_fs_chmod(loop,req_00,"test_file",0x80,chmod_cb);
    if (iVar3 != 0) goto LAB_0015b5e7;
    puVar13 = (uv_fs_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b48a;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_0015b5ec;
    chmod_cb_count = 0;
    puVar13 = &uStack_858;
    uStack_858.data = &run_test_fs_chmod::mode_1;
    puStack_868 = (uv_loop_t *)0x15b4cf;
    puVar8 = loop;
    iVar3 = uv_fs_chmod(loop,puVar13,"test_file",0x100,chmod_cb);
    if (iVar3 != 0) goto LAB_0015b5f1;
    puVar13 = (uv_fs_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b4e5;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_0015b5f6;
    puVar13 = &uStack_858;
    uStack_858.data = &run_test_fs_chmod::mode_2;
    puStack_868 = (uv_loop_t *)0x15b51b;
    puVar8 = loop;
    iVar3 = uv_fs_fchmod(loop,puVar13,uVar9,0x180,fchmod_cb);
    if (iVar3 != 0) goto LAB_0015b5fb;
    puVar13 = (uv_fs_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b531;
    puVar8 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fchmod_cb_count != 1) goto LAB_0015b600;
    puStack_868 = (uv_loop_t *)0x15b553;
    uv_fs_close(loop,&uStack_858,uVar9,(uv_fs_cb)0x0);
    puStack_868 = (uv_loop_t *)0x15b561;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_868 = (uv_loop_t *)0x15b56d;
    unlink("test_file");
    puStack_868 = (uv_loop_t *)0x15b572;
    puVar5 = uv_default_loop();
    puStack_868 = (uv_loop_t *)0x15b586;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puVar13 = (uv_fs_t *)0x0;
    puStack_868 = (uv_loop_t *)0x15b590;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_868 = (uv_loop_t *)0x15b595;
    puVar8 = uv_default_loop();
    puStack_868 = (uv_loop_t *)0x15b59d;
    iVar3 = uv_loop_close(puVar8);
    if (iVar3 == 0) {
      puStack_868 = (uv_loop_t *)0x15b5a6;
      uv_library_shutdown();
      return;
    }
  }
  puStack_868 = (uv_loop_t *)check_permission;
  run_test_fs_chmod_cold_17();
  puVar12 = (uv_fs_t *)((ulong)puVar13 & 0xffffffff);
  puVar15 = (uv_fs_t *)0x0;
  auStack_c00._464_8_ = (void *)0x15b625;
  puStack_868 = puVar5;
  iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(auStack_c00 + 0x1e0),(char *)puVar8,(uv_fs_cb)0x0)
  ;
  if (iVar3 == 0) {
    if (pvStack_9c8 != (void *)0x0) goto LAB_0015b659;
    if ((uStack_9a8 & 0x1ff) == (uint)puVar13) {
      auStack_c00._464_8_ = (void *)0x15b64b;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_c00 + 0x1e0));
      return;
    }
  }
  else {
    auStack_c00._464_8_ = (void *)0x15b659;
    check_permission_cold_1();
LAB_0015b659:
    auStack_c00._464_8_ = (void *)0x15b65e;
    check_permission_cold_2();
  }
  auStack_c00._464_8_ = chmod_cb;
  check_permission_cold_3();
  auStack_c00._464_8_ = puVar12;
  if (puVar15->fs_type == UV_FS_CHMOD) {
    puVar12 = puVar15;
    if (puVar15->result == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      auStack_c00._456_8_ = (uv__io_cb)0x15b682;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*puVar15->data);
      return;
    }
  }
  else {
    auStack_c00._456_8_ = (uv__io_cb)0x15b699;
    chmod_cb_cold_1();
  }
  auStack_c00._456_8_ = fchmod_cb;
  chmod_cb_cold_2();
  auStack_c00._456_8_ = puVar12;
  if (puVar15->fs_type == UV_FS_FCHMOD) {
    auStack_c00._440_8_ = puVar15;
    if (puVar15->result == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      auStack_c00._448_8_ = (_func_void *)0x15b6bd;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*puVar15->data);
      return;
    }
  }
  else {
    auStack_c00._448_8_ = (_func_void *)0x15b6d4;
    fchmod_cb_cold_1();
    auStack_c00._440_8_ = puVar12;
  }
  auStack_c00._448_8_ = run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar5 = (uv_loop_t *)0x1a3557;
  puStack_c18 = (uv_fs_t *)0x15b6f2;
  auStack_c00._448_8_ = req_00;
  unlink("test_file");
  puStack_c18 = (uv_fs_t *)0x15b6f7;
  loop = uv_default_loop();
  puStack_c18 = (uv_fs_t *)0x15b71b;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_c00,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_c00._88_8_;
  if (iVar3 < 0) {
    puStack_c18 = (uv_fs_t *)0x15b8bd;
    run_test_fs_unlink_readonly_cold_1();
LAB_0015b8bd:
    puStack_c18 = (uv_fs_t *)0x15b8c2;
    run_test_fs_unlink_readonly_cold_2();
LAB_0015b8c2:
    puStack_c18 = (uv_fs_t *)0x15b8c7;
    run_test_fs_unlink_readonly_cold_3();
LAB_0015b8c7:
    puStack_c18 = (uv_fs_t *)0x15b8cc;
    run_test_fs_unlink_readonly_cold_4();
LAB_0015b8cc:
    puStack_c18 = (uv_fs_t *)0x15b8d1;
    run_test_fs_unlink_readonly_cold_5();
LAB_0015b8d1:
    puStack_c18 = (uv_fs_t *)0x15b8d6;
    run_test_fs_unlink_readonly_cold_6();
LAB_0015b8d6:
    puStack_c18 = (uv_fs_t *)0x15b8db;
    run_test_fs_unlink_readonly_cold_7();
LAB_0015b8db:
    puStack_c18 = (uv_fs_t *)0x15b8e0;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_c00._88_8_;
    if ((long)auStack_c00._88_8_ < 0) goto LAB_0015b8bd;
    req_00 = (uv_fs_t *)auStack_c00;
    puStack_c18 = (uv_fs_t *)0x15b73e;
    uv_fs_req_cleanup(req_00);
    puStack_c18 = (uv_fs_t *)0x15b74f;
    uVar17 = uv_buf_init(test_buf,0xd);
    puStack_c18 = (uv_fs_t *)0x15b785;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req_00,(uv_file)uVar1,&iov,1,-1,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_0015b8c2;
    if ((uv_loop_t *)auStack_c00._88_8_ != (uv_loop_t *)0xd) goto LAB_0015b8c7;
    req_00 = (uv_fs_t *)auStack_c00;
    puStack_c18 = (uv_fs_t *)0x15b7a7;
    uv_fs_req_cleanup(req_00);
    puStack_c18 = (uv_fs_t *)0x15b7ba;
    uv_fs_close(loop,req_00,(uv_file)uVar1,(uv_fs_cb)0x0);
    puStack_c18 = (uv_fs_t *)0x15b7d3;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015b8cc;
    if ((uv_loop_t *)auStack_c00._88_8_ != (uv_loop_t *)0x0) goto LAB_0015b8d1;
    puVar5 = (uv_loop_t *)auStack_c00;
    puStack_c18 = (uv_fs_t *)0x15b7f4;
    uv_fs_req_cleanup((uv_fs_t *)puVar5);
    req_00 = (uv_fs_t *)0x1a3557;
    puStack_c18 = (uv_fs_t *)0x15b808;
    check_permission("test_file",0x100);
    puStack_c18 = (uv_fs_t *)0x15b817;
    iVar3 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)puVar5,"test_file",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015b8d6;
    if ((uv_loop_t *)auStack_c00._88_8_ != (uv_loop_t *)0x0) goto LAB_0015b8db;
    puStack_c18 = (uv_fs_t *)0x15b838;
    uv_fs_req_cleanup((uv_fs_t *)auStack_c00);
    puStack_c18 = (uv_fs_t *)0x15b846;
    uv_run(loop,UV_RUN_DEFAULT);
    req_00 = (uv_fs_t *)0x1a3557;
    puStack_c18 = (uv_fs_t *)0x15b862;
    uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_c00,"test_file",0x180,(uv_fs_cb)0x0);
    puStack_c18 = (uv_fs_t *)0x15b86a;
    uv_fs_req_cleanup((uv_fs_t *)auStack_c00);
    puStack_c18 = (uv_fs_t *)0x15b872;
    unlink("test_file");
    puStack_c18 = (uv_fs_t *)0x15b877;
    puVar5 = uv_default_loop();
    puStack_c18 = (uv_fs_t *)0x15b88b;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_c18 = (uv_fs_t *)0x15b895;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_c18 = (uv_fs_t *)0x15b89a;
    puVar8 = uv_default_loop();
    puStack_c18 = (uv_fs_t *)0x15b8a2;
    iVar3 = uv_loop_close(puVar8);
    if (iVar3 == 0) {
      puStack_c18 = (uv_fs_t *)0x15b8ab;
      uv_library_shutdown();
      return;
    }
  }
  puStack_c18 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar16 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
  puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
  puVar12 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
  puVar13 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
  puVar8 = (uv_loop_t *)0x1a3557;
  auStack_fc0._480_8_ = (void *)0x15b8fe;
  puStack_c20 = puVar5;
  puStack_c18 = req_00;
  unlink("test_file");
  auStack_fc0._480_8_ = (void *)0x15b90a;
  unlink("test_file_link");
  auStack_fc0._480_8_ = (void *)0x15b90f;
  loop = uv_default_loop();
  puVar10 = (uv_loop_t *)0x0;
  auStack_fc0._480_8_ = (void *)0x15b931;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar5 = puStack_d80;
  if (iVar3 < 0) {
    auStack_fc0._480_8_ = (void *)0x15bc07;
    run_test_fs_chown_cold_1();
LAB_0015bc07:
    auStack_fc0._480_8_ = (void *)0x15bc0c;
    run_test_fs_chown_cold_2();
LAB_0015bc0c:
    auStack_fc0._480_8_ = (void *)0x15bc11;
    run_test_fs_chown_cold_3();
LAB_0015bc11:
    puVar16 = req_00;
    auStack_fc0._480_8_ = (void *)0x15bc16;
    run_test_fs_chown_cold_4();
LAB_0015bc16:
    auStack_fc0._480_8_ = (void *)0x15bc1b;
    run_test_fs_chown_cold_5();
LAB_0015bc1b:
    puVar15 = puVar16;
    auStack_fc0._480_8_ = (void *)0x15bc20;
    run_test_fs_chown_cold_6();
LAB_0015bc20:
    auStack_fc0._480_8_ = (void *)0x15bc25;
    run_test_fs_chown_cold_7();
LAB_0015bc25:
    auStack_fc0._480_8_ = (void *)0x15bc2a;
    run_test_fs_chown_cold_8();
LAB_0015bc2a:
    auStack_fc0._480_8_ = (void *)0x15bc2f;
    run_test_fs_chown_cold_9();
LAB_0015bc2f:
    auStack_fc0._480_8_ = (void *)0x15bc34;
    run_test_fs_chown_cold_10();
LAB_0015bc34:
    auStack_fc0._480_8_ = (void *)0x15bc39;
    run_test_fs_chown_cold_11();
LAB_0015bc39:
    auStack_fc0._480_8_ = (void *)0x15bc3e;
    run_test_fs_chown_cold_12();
LAB_0015bc3e:
    auStack_fc0._480_8_ = (void *)0x15bc43;
    run_test_fs_chown_cold_13();
LAB_0015bc43:
    puVar12 = puVar15;
    auStack_fc0._480_8_ = (void *)0x15bc48;
    run_test_fs_chown_cold_14();
LAB_0015bc48:
    auStack_fc0._480_8_ = (void *)0x15bc4d;
    run_test_fs_chown_cold_15();
LAB_0015bc4d:
    puVar13 = puVar12;
    auStack_fc0._480_8_ = (void *)0x15bc52;
    run_test_fs_chown_cold_16();
LAB_0015bc52:
    auStack_fc0._480_8_ = (void *)0x15bc57;
    run_test_fs_chown_cold_17();
LAB_0015bc57:
    auStack_fc0._480_8_ = (void *)0x15bc5c;
    run_test_fs_chown_cold_18();
LAB_0015bc5c:
    auStack_fc0._480_8_ = (void *)0x15bc61;
    run_test_fs_chown_cold_19();
LAB_0015bc61:
    auStack_fc0._480_8_ = (void *)0x15bc66;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar8 = puStack_d80;
    if ((long)puStack_d80 < 0) goto LAB_0015bc07;
    auStack_fc0._480_8_ = (void *)0x15b952;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fc0 + 0x1e8));
    puVar10 = (uv_loop_t *)0x0;
    auStack_fc0._480_8_ = (void *)0x15b971;
    iVar3 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file",0xffffffff,
                        0xffffffff,(uv_fs_cb)0x0);
    puVar8 = puVar5;
    req_00 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (iVar3 != 0) goto LAB_0015bc0c;
    req_00 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (puStack_d80 != (uv_loop_t *)0x0) goto LAB_0015bc11;
    auStack_fc0._480_8_ = (void *)0x15b990;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fc0 + 0x1e8));
    puVar10 = (uv_loop_t *)0x0;
    uVar9 = (uv_file)puVar5;
    auStack_fc0._480_8_ = (void *)0x15b9aa;
    iVar3 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fc0 + 0x1e8),uVar9,0xffffffff,
                         0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015bc16;
    puVar16 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (puStack_d80 != (uv_loop_t *)0x0) goto LAB_0015bc1b;
    auStack_fc0._480_8_ = (void *)0x15b9c9;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fc0 + 0x1e8));
    auStack_fc0._480_8_ = (void *)0x15b9f1;
    puVar10 = loop;
    iVar3 = uv_fs_chown(loop,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file",0xffffffff,0xffffffff,
                        chown_cb);
    if (iVar3 != 0) goto LAB_0015bc20;
    auStack_fc0._480_8_ = (void *)0x15ba07;
    puVar10 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_0015bc25;
    chown_cb_count = 0;
    auStack_fc0._480_8_ = (void *)0x15ba40;
    puVar10 = loop;
    iVar3 = uv_fs_chown(loop,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file",0,0,chown_root_cb);
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (iVar3 != 0) goto LAB_0015bc2a;
    auStack_fc0._480_8_ = (void *)0x15ba56;
    puVar10 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_0015bc2f;
    auStack_fc0._480_8_ = (void *)0x15ba86;
    puVar10 = loop;
    iVar3 = uv_fs_fchown(loop,(uv_fs_t *)(auStack_fc0 + 0x1e8),uVar9,0xffffffff,0xffffffff,fchown_cb
                        );
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (iVar3 != 0) goto LAB_0015bc34;
    auStack_fc0._480_8_ = (void *)0x15ba9c;
    puVar10 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (fchown_cb_count != 1) goto LAB_0015bc39;
    puVar10 = (uv_loop_t *)0x0;
    auStack_fc0._480_8_ = (void *)0x15bac4;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (iVar3 != 0) goto LAB_0015bc3e;
    puVar15 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (puStack_d80 != (uv_loop_t *)0x0) goto LAB_0015bc43;
    auStack_fc0._480_8_ = (void *)0x15bae3;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fc0 + 0x1e8));
    puVar10 = (uv_loop_t *)0x0;
    auStack_fc0._480_8_ = (void *)0x15bb02;
    iVar3 = uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file_link",
                         0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015bc48;
    puVar12 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (puStack_d80 != (uv_loop_t *)0x0) goto LAB_0015bc4d;
    auStack_fc0._480_8_ = (void *)0x15bb21;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fc0 + 0x1e8));
    auStack_fc0._480_8_ = (void *)0x15bb49;
    puVar10 = loop;
    iVar3 = uv_fs_lchown(loop,(uv_fs_t *)(auStack_fc0 + 0x1e8),"test_file_link",0xffffffff,
                         0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_0015bc52;
    auStack_fc0._480_8_ = (void *)0x15bb5f;
    puVar10 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (lchown_cb_count != 1) goto LAB_0015bc57;
    puVar10 = (uv_loop_t *)0x0;
    auStack_fc0._480_8_ = (void *)0x15bb7a;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_fc0 + 0x1e8),uVar9,(uv_fs_cb)0x0);
    puVar13 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (iVar3 != 0) goto LAB_0015bc5c;
    puVar13 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (puStack_d80 != (uv_loop_t *)0x0) goto LAB_0015bc61;
    auStack_fc0._480_8_ = (void *)0x15bb96;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_fc0 + 0x1e8));
    auStack_fc0._480_8_ = (void *)0x15bba4;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_fc0._480_8_ = (void *)0x15bbb0;
    unlink("test_file");
    auStack_fc0._480_8_ = (void *)0x15bbbc;
    unlink("test_file_link");
    auStack_fc0._480_8_ = (void *)0x15bbc1;
    puVar8 = uv_default_loop();
    auStack_fc0._480_8_ = (void *)0x15bbd5;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    auStack_fc0._480_8_ = (void *)0x15bbdf;
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStack_fc0._480_8_ = (void *)0x15bbe4;
    puVar10 = uv_default_loop();
    auStack_fc0._480_8_ = (void *)0x15bbec;
    iVar3 = uv_loop_close(puVar10);
    puVar13 = (uv_fs_t *)(auStack_fc0 + 0x1e8);
    if (iVar3 == 0) {
      auStack_fc0._480_8_ = (void *)0x15bbf5;
      uv_library_shutdown();
      return;
    }
  }
  auStack_fc0._480_8_ = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar10->backend_fd == 0x1a) {
    if (puVar10->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar10);
      return;
    }
  }
  else {
    auStack_fc0._472_8_ = (void *)0x15bc8a;
    chown_cb_cold_1();
  }
  auStack_fc0._472_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_fc0._472_8_ = puVar8;
  if (puVar10->backend_fd == 0x1a) {
    auStack_fc0._464_8_ = (void *)0x15bc9e;
    puVar5 = puVar10;
    _Var4 = geteuid();
    pvVar7 = puVar10->watcher_queue[0];
    if (_Var4 != 0) {
      if (pvVar7 == (void *)0xffffffffffffffff) goto LAB_0015bcb6;
      auStack_fc0._464_8_ = (void *)0x15bcb1;
      chown_root_cb_cold_2();
    }
    puVar8 = puVar10;
    if (pvVar7 == (void *)0x0) {
LAB_0015bcb6:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar10);
      return;
    }
  }
  else {
    auStack_fc0._464_8_ = (void *)0x15bcca;
    chown_root_cb_cold_1();
    puVar5 = puVar10;
  }
  auStack_fc0._464_8_ = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar5->backend_fd == 0x1b) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return;
    }
  }
  else {
    auStack_fc0._456_8_ = (uv__io_cb)0x15bcee;
    fchown_cb_cold_1();
  }
  auStack_fc0._456_8_ = lchown_cb;
  fchown_cb_cold_2();
  if (puVar5->backend_fd == 0x1e) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return;
    }
  }
  else {
    auStack_fc0._448_8_ = (_func_void *)0x15bd12;
    lchown_cb_cold_1();
  }
  auStack_fc0._448_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar5 = (uv_loop_t *)0x1a3557;
  pcStackY_fd8 = (code *)0x15bd30;
  auStack_fc0._440_8_ = puVar8;
  auStack_fc0._448_8_ = puVar13;
  unlink("test_file");
  pcStackY_fd8 = (code *)0x15bd3c;
  unlink("test_file_link");
  pcStackY_fd8 = (code *)0x15bd48;
  unlink("test_file_link2");
  pcStackY_fd8 = (code *)0x15bd4d;
  loop = uv_default_loop();
  pcVar14 = (char *)0x0;
  pcStackY_fd8 = (code *)0x15bd71;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_fc0._88_8_;
  if (iVar3 < 0) {
    pcStackY_fd8 = (code *)0x15c0b4;
    run_test_fs_link_cold_1();
LAB_0015c0b4:
    pcStackY_fd8 = (code *)0x15c0b9;
    run_test_fs_link_cold_2();
LAB_0015c0b9:
    pcStackY_fd8 = (code *)0x15c0be;
    run_test_fs_link_cold_3();
LAB_0015c0be:
    pcStackY_fd8 = (code *)0x15c0c3;
    run_test_fs_link_cold_4();
LAB_0015c0c3:
    pcStackY_fd8 = (code *)0x15c0c8;
    run_test_fs_link_cold_5();
LAB_0015c0c8:
    pcStackY_fd8 = (code *)0x15c0cd;
    run_test_fs_link_cold_6();
LAB_0015c0cd:
    puVar8 = puVar5;
    pcStackY_fd8 = (code *)0x15c0d2;
    run_test_fs_link_cold_7();
LAB_0015c0d2:
    pcStackY_fd8 = (code *)0x15c0d7;
    run_test_fs_link_cold_8();
LAB_0015c0d7:
    pcStackY_fd8 = (code *)0x15c0dc;
    run_test_fs_link_cold_9();
LAB_0015c0dc:
    pcStackY_fd8 = (code *)0x15c0e1;
    run_test_fs_link_cold_10();
LAB_0015c0e1:
    pcStackY_fd8 = (code *)0x15c0e6;
    run_test_fs_link_cold_11();
LAB_0015c0e6:
    pcStackY_fd8 = (code *)0x15c0eb;
    run_test_fs_link_cold_12();
LAB_0015c0eb:
    pcStackY_fd8 = (code *)0x15c0f0;
    run_test_fs_link_cold_13();
LAB_0015c0f0:
    puVar5 = puVar8;
    pcStackY_fd8 = (code *)0x15c0f5;
    run_test_fs_link_cold_14();
LAB_0015c0f5:
    pcStackY_fd8 = (code *)0x15c0fa;
    run_test_fs_link_cold_15();
LAB_0015c0fa:
    pcStackY_fd8 = (code *)0x15c0ff;
    run_test_fs_link_cold_16();
LAB_0015c0ff:
    pcStackY_fd8 = (code *)0x15c104;
    run_test_fs_link_cold_17();
LAB_0015c104:
    pcStackY_fd8 = (code *)0x15c109;
    run_test_fs_link_cold_18();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_fc0._88_8_;
    if ((long)auStack_fc0._88_8_ < 0) goto LAB_0015c0b4;
    pcStackY_fd8 = (code *)0x15bd94;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fc0);
    pcStackY_fd8 = (code *)0x15bda5;
    uVar17 = uv_buf_init(test_buf,0xd);
    pcVar14 = (char *)0x0;
    pcStackY_fd8 = (code *)0x15bddb;
    iov = uVar17;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,(uv_file)uVar1,&iov,1,-1,
                        (uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_0015c0b9;
    if ((uv_loop_t *)auStack_fc0._88_8_ != (uv_loop_t *)0xd) goto LAB_0015c0be;
    pcStackY_fd8 = (code *)0x15bdfd;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fc0);
    pcStackY_fd8 = (code *)0x15be10;
    uv_fs_close(loop,(uv_fs_t *)auStack_fc0,(uv_file)uVar1,(uv_fs_cb)0x0);
    pcVar14 = (char *)0x0;
    pcStackY_fd8 = (code *)0x15be2b;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,"test_file","test_file_link",
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015c0c3;
    if ((uv_loop_t *)auStack_fc0._88_8_ != (uv_loop_t *)0x0) goto LAB_0015c0c8;
    pcStackY_fd8 = (code *)0x15be4c;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fc0);
    pcVar14 = (char *)0x0;
    pcStackY_fd8 = (code *)0x15be68;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar8 = (uv_loop_t *)auStack_fc0._88_8_;
    puVar5 = (uv_loop_t *)auStack_fc0;
    if (iVar3 < 0) goto LAB_0015c0cd;
    if ((long)auStack_fc0._88_8_ < 0) goto LAB_0015c0d2;
    pcStackY_fd8 = (code *)0x15be8b;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fc0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_fd8 = (code *)0x15bead;
    uVar17 = uv_buf_init(buf,0x20);
    pcVar14 = (char *)0x0;
    pcStackY_fd8 = (code *)0x15bedf;
    iov = uVar17;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,(uv_file)puVar8,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015c0d7;
    if ((long)auStack_fc0._88_8_ < 0) goto LAB_0015c0dc;
    pcVar14 = buf;
    pcStackY_fd8 = (code *)0x15bf06;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_0015c0e1;
    pcStackY_fd8 = (code *)0x15bf15;
    close((uv_file)puVar8);
    pcStackY_fd8 = (code *)0x15bf3b;
    pcVar14 = (char *)loop;
    iVar3 = uv_fs_link(loop,(uv_fs_t *)auStack_fc0,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_0015c0e6;
    pcStackY_fd8 = (code *)0x15bf51;
    pcVar14 = (char *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_0015c0eb;
    pcVar14 = (char *)0x0;
    pcStackY_fd8 = (code *)0x15bf7c;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,"test_file_link2",2,0,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)auStack_fc0._88_8_;
    if (iVar3 < 0) goto LAB_0015c0f0;
    if ((long)auStack_fc0._88_8_ < 0) goto LAB_0015c0f5;
    pcStackY_fd8 = (code *)0x15bf9f;
    uv_fs_req_cleanup((uv_fs_t *)auStack_fc0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_fd8 = (code *)0x15bfc1;
    uVar17 = uv_buf_init(buf,0x20);
    pcVar14 = (char *)0x0;
    pcStackY_fd8 = (code *)0x15bff3;
    iov = uVar17;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_fc0,(uv_file)puVar5,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015c0fa;
    if ((long)auStack_fc0._88_8_ < 0) goto LAB_0015c0ff;
    pcVar14 = buf;
    pcStackY_fd8 = (code *)0x15c01a;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_0015c104;
    pcStackY_fd8 = (code *)0x15c037;
    uv_fs_close(loop,(uv_fs_t *)auStack_fc0,(uv_file)puVar5,(uv_fs_cb)0x0);
    pcStackY_fd8 = (code *)0x15c045;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStackY_fd8 = (code *)0x15c051;
    unlink("test_file");
    pcStackY_fd8 = (code *)0x15c05d;
    unlink("test_file_link");
    pcStackY_fd8 = (code *)0x15c069;
    unlink("test_file_link2");
    pcStackY_fd8 = (code *)0x15c06e;
    puVar5 = uv_default_loop();
    pcStackY_fd8 = (code *)0x15c082;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_fd8 = (code *)0x15c08c;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_fd8 = (code *)0x15c091;
    pcVar14 = (char *)uv_default_loop();
    pcStackY_fd8 = (code *)0x15c099;
    iVar3 = uv_loop_close((uv_loop_t *)pcVar14);
    if (iVar3 == 0) {
      pcStackY_fd8 = (code *)0x15c0a2;
      uv_library_shutdown();
      return;
    }
  }
  pcStackY_fd8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar14)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar14)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)pcVar14);
      return;
    }
  }
  else {
    puStackY_fe0 = (uv_loop_t *)0x15c12d;
    link_cb_cold_1();
  }
  puStackY_fe0 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_fe0 = puVar5;
  loop = uv_default_loop();
  iVar3 = uv_fs_readlink(loop,&uStackY_1198,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_0015c230;
    if (dummy_cb_count != 1) goto LAB_0015c235;
    if (uStackY_1198.ptr != (void *)0x0) goto LAB_0015c23a;
    if (uStackY_1198.result != -2) goto LAB_0015c23f;
    uv_fs_req_cleanup(&uStackY_1198);
    iVar3 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_1198,"no_such_file",(uv_fs_cb)0x0);
    if (iVar3 != -2) goto LAB_0015c244;
    if (uStackY_1198.ptr != (void *)0x0) goto LAB_0015c249;
    if (uStackY_1198.result == -2) {
      uv_fs_req_cleanup(&uStackY_1198);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar3 = uv_loop_close(puVar5);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015c253;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015c230:
    run_test_fs_readlink_cold_2();
LAB_0015c235:
    run_test_fs_readlink_cold_3();
LAB_0015c23a:
    run_test_fs_readlink_cold_4();
LAB_0015c23f:
    run_test_fs_readlink_cold_5();
LAB_0015c244:
    run_test_fs_readlink_cold_6();
LAB_0015c249:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015c253:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void sendfile_nodata_cb(uv_fs_t* req) {
  ASSERT(req == &sendfile_req);
  ASSERT(req->fs_type == UV_FS_SENDFILE);
  ASSERT(req->result == 0);
  sendfile_cb_count++;
  uv_fs_req_cleanup(req);
}